

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.hpp
# Opt level: O0

string * __thiscall
duckdb::CSVStateMachineCache::GetObjectType_abi_cxx11_(CSVStateMachineCache *this)

{
  string *in_RDI;
  
  ObjectType_abi_cxx11_();
  return in_RDI;
}

Assistant:

string GetObjectType() override {
		return ObjectType();
	}